

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  size_t sVar1;
  long lVar2;
  float extraout_XMM0_Da;
  
  sVar1 = Matrix::size(A,0);
  if (sVar1 != (this->data_).size_) {
    __assert_fail("A.size(0) == size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                  ,0x45,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  sVar1 = Matrix::size(A,1);
  if (sVar1 == (vec->data_).size_) {
    if (0 < (long)(this->data_).size_) {
      lVar2 = 0;
      do {
        (*A->_vptr_Matrix[2])(A,vec,lVar2);
        (this->data_).mem_[lVar2] = extraout_XMM0_Da;
        lVar2 = lVar2 + 1;
      } while (lVar2 < (long)(this->data_).size_);
    }
    return;
  }
  __assert_fail("A.size(1) == vec.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,0x46,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}